

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

ostream * std::operator<<(ostream *ofs,Visibility v)

{
  Visibility in_EDX;
  undefined4 in_register_00000034;
  string local_30;
  
  tinyusdz::to_string_abi_cxx11_(&local_30,(tinyusdz *)CONCAT44(in_register_00000034,v),in_EDX);
  std::operator<<(ofs,(string *)&local_30);
  std::__cxx11::string::_M_dispose();
  return ofs;
}

Assistant:

std::ostream &operator<<(std::ostream &ofs, const tinyusdz::Visibility v) {
  ofs << to_string(v);
  return ofs;
}